

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int Curl_ossl_shutdown(connectdata *conn,int sockindex)

{
  Curl_easy *data;
  Curl_easy *data_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong e;
  uint *puVar4;
  bool bVar5;
  char *buf_00;
  char buf [256];
  int local_154;
  char local_138 [264];
  
  data = conn->data;
  if ((data->set).ftp_ccc == CURLFTPSSL_CCC_ACTIVE) {
    SSL_shutdown((SSL *)(conn->ssl[sockindex].backend)->handle);
  }
  if ((conn->ssl[sockindex].backend)->handle == (SSL *)0x0) {
    local_154 = 0;
  }
  else {
    local_154 = 0;
    bVar1 = false;
    do {
      iVar2 = Curl_socket_check(conn->sock[sockindex],-1,-1,10000);
      if (iVar2 < 1) {
        if (iVar2 == 0) {
          Curl_failf(data,"SSL shutdown timeout");
        }
        else {
          puVar4 = (uint *)__errno_location();
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
          local_154 = -1;
        }
        bVar5 = true;
      }
      else {
        ERR_clear_error();
        iVar2 = SSL_read((SSL *)(conn->ssl[sockindex].backend)->handle,local_138,0x100);
        uVar3 = SSL_get_error((SSL *)(conn->ssl[sockindex].backend)->handle,iVar2);
        bVar5 = true;
        switch((ulong)uVar3) {
        case 0:
        case 6:
          break;
        default:
          e = ERR_get_error();
          data_00 = conn->data;
          if (e == 0) {
            buf_00 = "SSL_ERROR unknown";
            if (uVar3 < 0xb) {
              buf_00 = (&PTR_anon_var_dwarf_ab57e_00155b78)[uVar3];
            }
          }
          else {
            buf_00 = local_138;
            ERR_error_string_n(e,buf_00,0x100);
          }
          puVar4 = (uint *)__errno_location();
          Curl_failf(data_00,"OpenSSL SSL_read on shutdown: %s, errno %d",buf_00,(ulong)*puVar4);
          break;
        case 2:
          Curl_infof(data,"SSL_ERROR_WANT_READ\n");
          bVar5 = bVar1;
          break;
        case 3:
          Curl_infof(data,"SSL_ERROR_WANT_WRITE\n");
        }
      }
      bVar1 = bVar5;
    } while (!bVar5);
    SSL_free((SSL *)(conn->ssl[sockindex].backend)->handle);
    (conn->ssl[sockindex].backend)->handle = (SSL *)0x0;
  }
  return local_154;
}

Assistant:

static int Curl_ossl_shutdown(struct connectdata *conn, int sockindex)
{
  int retval = 0;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct Curl_easy *data = conn->data;
  char buf[256]; /* We will use this for the OpenSSL error buffer, so it has
                    to be at least 256 bytes long. */
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  int err;
  bool done = FALSE;

#ifndef CURL_DISABLE_FTP
  /* This has only been tested on the proftpd server, and the mod_tls code
     sends a close notify alert without waiting for a close notify alert in
     response. Thus we wait for a close notify alert from the server, but
     we do not send one. Let's hope other servers do the same... */

  if(data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE)
      (void)SSL_shutdown(BACKEND->handle);
#endif

  if(BACKEND->handle) {
    buffsize = (int)sizeof(buf);
    while(!done) {
      int what = SOCKET_READABLE(conn->sock[sockindex],
                                 SSL_SHUTDOWN_TIMEOUT);
      if(what > 0) {
        ERR_clear_error();

        /* Something to read, let's do it and hope that it is the close
           notify alert from the server */
        nread = (ssize_t)SSL_read(BACKEND->handle, buf, buffsize);
        err = SSL_get_error(BACKEND->handle, (int)nread);

        switch(err) {
        case SSL_ERROR_NONE: /* this is not an error */
        case SSL_ERROR_ZERO_RETURN: /* no more data */
          /* This is the expected response. There was no data but only
             the close notify alert */
          done = TRUE;
          break;
        case SSL_ERROR_WANT_READ:
          /* there's data pending, re-invoke SSL_read() */
          infof(data, "SSL_ERROR_WANT_READ\n");
          break;
        case SSL_ERROR_WANT_WRITE:
          /* SSL wants a write. Really odd. Let's bail out. */
          infof(data, "SSL_ERROR_WANT_WRITE\n");
          done = TRUE;
          break;
        default:
          /* openssl/ssl.h says "look at error stack/return value/errno" */
          sslerror = ERR_get_error();
          failf(conn->data, OSSL_PACKAGE " SSL_read on shutdown: %s, errno %d",
                (sslerror ?
                 ossl_strerror(sslerror, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
          done = TRUE;
          break;
        }
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        done = TRUE;
      }
      else {
        /* anything that gets here is fatally bad */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        retval = -1;
        done = TRUE;
      }
    } /* while()-loop for the select() */

    if(data->set.verbose) {
#ifdef HAVE_SSL_GET_SHUTDOWN
      switch(SSL_get_shutdown(BACKEND->handle)) {
      case SSL_SENT_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN\n");
        break;
      case SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_RECEIVED_SHUTDOWN\n");
        break;
      case SSL_SENT_SHUTDOWN|SSL_RECEIVED_SHUTDOWN:
        infof(data, "SSL_get_shutdown() returned SSL_SENT_SHUTDOWN|"
              "SSL_RECEIVED__SHUTDOWN\n");
        break;
      }
#endif
    }

    SSL_free(BACKEND->handle);
    BACKEND->handle = NULL;
  }
  return retval;
}